

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  ofstream ppm;
  long local_1018;
  filebuf local_1010 [240];
  ios_base local_f20 [264];
  OutputImage<cert::Color,_120UL,_10UL> local_e18;
  
  std::ofstream::ofstream(&local_1018,"output_compiletime.ppm",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1018,"P3\n",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_1018,0x78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n255\n",5);
  get_frame_0();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_1();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_2();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_3();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_4();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_5();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_6();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_7();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_8();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_9();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_10();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  get_frame_11();
  print_image<cert::OutputImage<cert::Color,120ul,10ul>>((ofstream *)&local_1018,&local_e18);
  local_1018 = _VTT;
  *(undefined8 *)(local_1010 + *(long *)(_VTT + -0x18) + -8) = ___cxa_atexit;
  std::filebuf::~filebuf(local_1010);
  std::ios_base::~ios_base(local_f20);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
	std::ofstream ppm ("output_compiletime.ppm");
	ppm << "P3\n" << width << " " << height << "\n255\n";
	print_image (ppm, get_frame_0 ());
	print_image (ppm, get_frame_1 ());
	print_image (ppm, get_frame_2 ());
	print_image (ppm, get_frame_3 ());
	print_image (ppm, get_frame_4 ());
	print_image (ppm, get_frame_5 ());
	print_image (ppm, get_frame_6 ());
	print_image (ppm, get_frame_7 ());
	print_image (ppm, get_frame_8 ());
	print_image (ppm, get_frame_9 ());
	print_image (ppm, get_frame_10 ());
	print_image (ppm, get_frame_11 ());
}